

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int formatf(void *userp,_func_int_uchar_void_ptr *stream,char *format,__va_list_tag *ap_save)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  double *pdVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  int *piVar10;
  double dVar11;
  uint *puVar12;
  double *pdVar13;
  char *__s;
  int iVar14;
  long lVar15;
  double dVar16;
  uint uVar17;
  uint uVar18;
  byte bVar19;
  uint uVar20;
  double dVar21;
  size_t maxlength;
  byte bVar22;
  byte *pbVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  int in_R10D;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  uint uVar31;
  uchar *puVar32;
  bool bVar33;
  bool bVar34;
  char formatbuf [32];
  char work [326];
  va_input input [128];
  outsegment output [128];
  byte local_19fc;
  byte *local_19f0;
  char *local_19e8;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  ulong local_1998;
  ulong local_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  uint local_1838 [2];
  double local_1830 [255];
  uint local_1038 [2];
  undefined8 local_1030;
  long local_1028 [511];
  
  local_1988 = 0;
  uStack_1980 = 0;
  uVar29 = 0;
  uVar27 = 0xffffffff;
  iVar3 = 0;
  uVar7 = 0;
  local_19b8 = (byte *)format;
  do {
    lVar15 = 0;
    while( true ) {
      uVar31 = (uint)uVar29;
      if (local_19b8[lVar15] == 0) {
        pbVar5 = local_19b8 + lVar15;
        if (pbVar5 != (byte *)format) {
          if (0x7f < (int)uVar31) {
            in_R10D = 0xb;
            local_19b8 = pbVar5;
            goto LAB_001426e5;
          }
          lVar24 = (long)(int)uVar31;
          uVar29 = (ulong)(uVar31 + 1);
          (&local_1030)[lVar24 * 4] = 0x100000;
          local_1028[lVar24 * 4] = (long)format;
          local_1028[lVar24 * 4 + 1] = (long)(local_19b8 + (lVar15 - (long)format));
        }
        uVar31 = (uint)uVar29;
        if ((int)uVar27 < 0) goto LAB_00142840;
        pdVar6 = local_1830;
        uVar29 = 0;
        goto LAB_00142734;
      }
      if (local_19b8[lVar15] == 0x25) break;
      lVar15 = lVar15 + 1;
    }
    pbVar23 = local_19b8 + lVar15 + 1;
    pbVar5 = local_19b8 + (lVar15 - (long)format);
    if (*pbVar23 == 0x25) {
      if (pbVar5 == (byte *)0x0) {
LAB_00141f67:
        local_19b8 = local_19b8 + lVar15 + 2;
        format = (char *)pbVar23;
        uVar17 = uVar31;
        iVar14 = iVar3;
        goto LAB_00141f73;
      }
      if ((int)uVar31 < 0x80) {
        lVar24 = (long)(int)uVar31;
        (&local_1030)[lVar24 * 4] = 0x100000;
        local_1028[lVar24 * 4] = (long)format;
        local_1028[lVar24 * 4 + 1] = (long)pbVar5;
        uVar31 = uVar31 + 1;
        goto LAB_00141f67;
      }
      in_R10D = 0xb;
      bVar34 = true;
      uVar31 = uVar31 + 1;
      local_19b8 = pbVar23;
      goto LAB_00142326;
    }
    uVar18 = 0xffffffff;
    local_19f0 = pbVar5;
    if (iVar3 == 1) {
      iVar14 = 1;
      bVar34 = false;
      local_19b8 = pbVar23;
    }
    else {
      local_19b8 = pbVar23;
      uVar18 = dollarstring((char *)pbVar23,(char **)&local_19b8);
      if ((int)uVar18 < 0) {
        iVar14 = 1;
        if (iVar3 == 2) {
          in_R10D = 1;
          iVar3 = 2;
LAB_00142321:
          bVar34 = true;
          goto LAB_00142326;
        }
        bVar34 = false;
        uVar18 = 0xffffffff;
      }
      else {
        iVar14 = 2;
        bVar34 = true;
      }
    }
    uVar9 = 0;
    bVar30 = true;
    local_19e8 = (char *)0x0;
    uVar20 = 0;
    do {
      pbVar23 = local_19b8 + 1;
      bVar1 = *local_19b8;
      iVar3 = iVar14;
      if (0x4b < bVar1) {
        if (bVar1 < 0x6c) {
          if (bVar1 == 0x4c) {
            uVar9 = uVar9 | 0x80;
            local_19b8 = pbVar23;
          }
          else {
            if (bVar1 == 0x4f) goto LAB_001421cc;
            if (bVar1 != 0x68) goto switchD_00142002_caseD_21;
            uVar9 = uVar9 | 0x10;
            local_19b8 = pbVar23;
          }
        }
        else {
          if (bVar1 == 0x6c) {
            if ((uVar9 & 0x20) != 0) goto LAB_001421d5;
          }
          else {
            if (bVar1 == 0x71) {
LAB_001421d5:
              uVar9 = uVar9 | 0x40;
              local_19b8 = pbVar23;
              goto LAB_0014228c;
            }
            if (bVar1 != 0x7a) goto switchD_00142002_caseD_21;
          }
LAB_001421cc:
          uVar9 = uVar9 | 0x20;
          local_19b8 = pbVar23;
        }
        goto LAB_0014228c;
      }
      switch(bVar1) {
      case 0x20:
        uVar9 = uVar9 | 1;
        local_19b8 = pbVar23;
        break;
      default:
switchD_00142002_caseD_21:
        bVar30 = false;
        break;
      case 0x23:
        uVar9 = uVar9 | 8;
        local_19b8 = pbVar23;
        break;
      case 0x2a:
        uVar9 = uVar9 | 0x4000;
        uVar20 = 0xffffffff;
        local_19b8 = pbVar23;
        if ((bVar34) &&
           (local_1998 = uVar29, uVar20 = dollarstring((char *)pbVar23,(char **)&local_19b8),
           uVar29 = local_1998, (int)uVar20 < 0)) {
          iVar3 = 2;
          uVar31 = (uint)local_1998;
          in_R10D = 2;
          goto LAB_00142321;
        }
        break;
      case 0x2b:
        uVar9 = uVar9 | 2;
        local_19b8 = pbVar23;
        break;
      case 0x2d:
        uVar9 = uVar9 & 0xfffffefb | 4;
        local_19b8 = pbVar23;
        break;
      case 0x2e:
        bVar1 = *pbVar23;
        if (bVar1 == 0x2a) {
          uVar9 = uVar9 | 0x10000;
          local_19b8 = local_19b8 + 2;
          local_19e8 = (char *)0xffffffff;
          if (bVar34) {
            local_1998 = uVar29;
            local_1990 = uVar27;
            uVar31 = dollarstring((char *)local_19b8,(char **)&local_19b8);
            local_19e8 = (char *)(ulong)uVar31;
            uVar29 = local_1998;
            uVar27 = local_1990;
            if ((int)uVar31 < 0) {
              in_R10D = 3;
              uVar31 = (uint)local_1998;
              iVar3 = 2;
              goto LAB_00142321;
            }
          }
        }
        else {
          if (bVar1 == 0x2d) {
            pbVar23 = local_19b8 + 2;
          }
          local_19b8 = pbVar23;
          bVar22 = *local_19b8;
          uVar25 = 0;
          bVar33 = (byte)(bVar22 - 0x3a) < 0xf6;
          if (bVar33) {
LAB_00142205:
            local_19e8 = (char *)(ulong)(uint)-(int)uVar25;
            if (bVar1 != 0x2d) {
              local_19e8 = (char *)uVar25;
            }
          }
          else {
            uVar25 = 0;
            do {
              local_19b8 = local_19b8 + 1;
              uVar31 = (uint)(byte)(bVar22 - 0x30) + (int)uVar25 * 10;
              uVar25 = (ulong)uVar31;
              bVar22 = *local_19b8;
              bVar33 = (byte)(bVar22 - 0x3a) < 0xf6;
              if (bVar33) goto LAB_00142205;
            } while ((int)uVar31 < 0xccccccd);
            in_R10D = 5;
            local_19e8 = (char *)uVar25;
          }
          if (!bVar33) {
            uVar31 = (uint)uVar29;
            goto LAB_00142321;
          }
          uVar9 = uVar9 | 0x8000;
        }
        if ((~uVar9 & 0x18000) == 0) {
          in_R10D = 6;
LAB_00142314:
          uVar31 = (uint)uVar29;
          goto LAB_00142321;
        }
        break;
      case 0x30:
        uVar9 = uVar9 | (~uVar9 & 4) << 6;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        uVar9 = uVar9 | 0x2000;
        uVar20 = 0;
        do {
          if (0xccccccc < (int)uVar20) {
            in_R10D = 7;
            goto LAB_00142314;
          }
          uVar20 = ((int)(char)*local_19b8 + uVar20 * 10) - 0x30;
          pbVar23 = local_19b8 + 1;
          local_19b8 = local_19b8 + 1;
        } while ((byte)(*pbVar23 - 0x30) < 10);
      }
LAB_0014228c:
    } while (bVar30);
    local_1998 = CONCAT44(local_1998._4_4_,uVar18);
    bVar1 = *local_19b8;
    uVar17 = (uint)uVar29;
    if (bVar1 < 0x58) {
      if (bVar1 == 0x45) {
        uVar9 = uVar9 | 0x41000;
        uVar31 = 9;
        goto LAB_0014245e;
      }
      uVar31 = 0;
      if (bVar1 == 0x47) {
        uVar9 = uVar9 | 0x81000;
        uVar31 = 9;
        goto LAB_0014245e;
      }
      if (bVar1 == 0x53) {
        uVar9 = uVar9 | 8;
        goto LAB_0014245e;
      }
      goto LAB_00141f73;
    }
    uVar31 = 0;
    switch(bVar1) {
    case 99:
      uVar9 = uVar9 | 0x20000;
      goto LAB_00142405;
    case 100:
    case 0x69:
      if ((uVar9 & 0x40) == 0) {
        uVar31 = 4 - ((uVar9 & 0x20) == 0);
      }
      else {
        uVar31 = 5;
      }
      break;
    case 0x65:
      uVar9 = uVar9 | 0x40000;
      goto LAB_00142421;
    case 0x66:
      uVar31 = 9;
    case 0x73:
switchD_001422df_caseD_73:
      break;
    case 0x67:
      uVar9 = uVar9 | 0x80000;
LAB_00142421:
      uVar31 = 9;
      break;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
      goto switchD_001422df_caseD_68;
    case 0x6e:
      uVar31 = 2;
      goto switchD_001422df_caseD_73;
    case 0x6f:
      uVar9 = uVar9 | 0x400;
LAB_00142405:
      uVar31 = 3;
      break;
    case 0x70:
      uVar31 = 1;
      goto switchD_001422df_caseD_73;
    case 0x75:
      uVar31 = 7 - ((uVar9 & 0x20) == 0);
      if ((uVar9 & 0x40) != 0) {
        uVar31 = 8;
      }
      uVar9 = uVar9 | 0x200;
      break;
    case 0x78:
      uVar9 = uVar9 | 0xa00;
LAB_00142433:
      uVar31 = 6;
      break;
    default:
      if (bVar1 == 0x58) {
        uVar9 = uVar9 | 0x1a00;
        goto LAB_00142433;
      }
      goto switchD_001422df_caseD_68;
    }
LAB_0014245e:
    uVar29 = uVar7;
    if ((uVar9 >> 0xe & 1) == 0) {
LAB_001424e6:
      uVar7 = uVar29;
      if ((uVar9 >> 0x10 & 1) != 0) {
        if ((int)(uint)local_19e8 < 0) {
          uVar7 = (ulong)((int)uVar29 + 1);
          local_19e8 = (char *)uVar29;
        }
        else if ((*(byte *)((long)&local_1988 + ((ulong)local_19e8 >> 3)) >> ((uint)local_19e8 & 7)
                 & 1) != 0) {
          in_R10D = 10;
          goto LAB_001425a7;
        }
        if (0x7f < (int)(uint)local_19e8) goto LAB_00142532;
        if ((int)uVar27 < (int)(uint)local_19e8) {
          uVar27 = (ulong)local_19e8;
        }
        uVar27 = uVar27 & 0xffffffff;
        local_1838[(long)(int)(uint)local_19e8 * 4] = 0xc;
        uVar26 = (uint)local_19e8 + 7;
        if (-1 < (int)(uint)local_19e8) {
          uVar26 = (uint)local_19e8;
        }
        pbVar23 = (byte *)((long)&local_1988 + (long)((int)uVar26 >> 3));
        *pbVar23 = *pbVar23 | (byte)(1 << ((byte)local_19e8 & 7));
      }
      uVar29 = (ulong)uVar18;
      if ((int)uVar18 < 0) {
        uVar29 = uVar7;
      }
      uVar7 = (ulong)(uint)((int)uVar7 - ((int)uVar18 >> 0x1f));
      iVar14 = (int)uVar29;
      if (0x7f < iVar14) {
        in_R10D = 4;
        goto LAB_001425a7;
      }
      iVar4 = (int)uVar27;
      uVar27 = uVar27 & 0xffffffff;
      if (iVar4 < iVar14) {
        uVar27 = uVar29;
      }
      local_1838[(long)iVar14 * 4] = uVar31;
      iVar4 = iVar14 + 7;
      if (-1 < iVar14) {
        iVar4 = iVar14;
      }
      pbVar23 = (byte *)((long)&local_1988 + (long)(iVar4 >> 3));
      *pbVar23 = *pbVar23 | (byte)(1 << ((byte)uVar29 & 7));
      local_19b8 = local_19b8 + 1;
      uVar31 = uVar17 + 1;
      if ((int)uVar17 < 0x80) {
        lVar15 = (long)(int)uVar17;
        *(int *)((long)local_1028 + lVar15 * 0x20 + -4) = iVar14;
        *(uint *)(&local_1030 + lVar15 * 4) = uVar9;
        local_1038[lVar15 * 8] = uVar20;
        local_1038[lVar15 * 8 + 1] = (uint)local_19e8;
        local_1028[lVar15 * 4] = (long)format;
        local_1028[lVar15 * 4 + 1] = (long)pbVar5;
        bVar34 = false;
        format = (char *)local_19b8;
      }
      else {
        bVar34 = true;
        in_R10D = 0xb;
      }
    }
    else {
      if ((int)uVar20 < 0) {
        uVar20 = (uint)uVar7;
        uVar7 = (ulong)(uVar20 + 1);
LAB_0014249f:
        if ((int)uVar20 < 0x80) {
          iVar14 = (int)uVar27;
          uVar27 = uVar27 & 0xffffffff;
          if (iVar14 < (int)uVar20) {
            uVar27 = (ulong)uVar20;
          }
          local_1838[(long)(int)uVar20 * 4] = 0xb;
          uVar26 = uVar20 + 7;
          if (-1 < (int)uVar20) {
            uVar26 = uVar20;
          }
          pbVar23 = (byte *)((long)&local_1988 + (long)((int)uVar26 >> 3));
          *pbVar23 = *pbVar23 | (byte)(1 << ((byte)uVar20 & 7));
          uVar29 = uVar7;
          goto LAB_001424e6;
        }
LAB_00142532:
        in_R10D = 4;
      }
      else {
        if ((*(byte *)((long)&local_1988 + (ulong)(uVar20 >> 3)) >> (uVar20 & 7) & 1) == 0)
        goto LAB_0014249f;
        in_R10D = 9;
      }
LAB_001425a7:
      bVar34 = true;
      uVar31 = uVar17;
    }
LAB_00142326:
    uVar29 = (ulong)uVar31;
  } while (!bVar34);
LAB_001426e5:
  uVar31 = 0;
  goto LAB_00142843;
  while( true ) {
    uVar29 = uVar29 + 1;
    pdVar6 = pdVar6 + 2;
    if ((int)uVar27 + 1 == uVar29) break;
LAB_00142734:
    uVar17 = 1 << ((byte)uVar29 & 7) &
             (uint)*(byte *)((long)&local_1988 + (uVar29 >> 3 & 0x1fffffff));
    if (uVar17 == 0) {
      in_R10D = 8;
      goto switchD_00142767_caseD_a;
    }
    switch(*(undefined4 *)(pdVar6 + -1)) {
    case 0:
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      uVar18 = ap_save->gp_offset;
      if ((ulong)uVar18 < 0x29) {
        pdVar13 = (double *)((ulong)uVar18 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar18 + 8;
      }
      else {
        pdVar13 = (double *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = pdVar13 + 1;
      }
      dVar11 = *pdVar13;
      break;
    case 3:
    case 0xb:
    case 0xc:
      uVar18 = ap_save->gp_offset;
      if ((ulong)uVar18 < 0x29) {
        piVar10 = (int *)((ulong)uVar18 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar18 + 8;
      }
      else {
        piVar10 = (int *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = piVar10 + 2;
      }
      dVar11 = (double)(long)*piVar10;
      break;
    case 6:
      uVar18 = ap_save->gp_offset;
      if ((ulong)uVar18 < 0x29) {
        puVar12 = (uint *)((ulong)uVar18 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar18 + 8;
      }
      else {
        puVar12 = (uint *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = puVar12 + 2;
      }
      dVar11 = (double)(ulong)*puVar12;
      break;
    case 9:
      uVar18 = ap_save->fp_offset;
      if ((ulong)uVar18 < 0xa1) {
        pdVar13 = (double *)((ulong)uVar18 + (long)ap_save->reg_save_area);
        ap_save->fp_offset = uVar18 + 0x10;
      }
      else {
        pdVar13 = (double *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = pdVar13 + 1;
      }
      *pdVar6 = *pdVar13;
    default:
      goto switchD_00142767_caseD_a;
    }
    *pdVar6 = dVar11;
switchD_00142767_caseD_a:
    local_19b8 = pbVar5;
    if (uVar17 == 0) goto LAB_001426e5;
  }
LAB_00142840:
  in_R10D = 0;
  local_19b8 = pbVar5;
LAB_00142843:
  if ((in_R10D != 0) || ((int)uVar31 < 1)) {
    return 0;
  }
  uVar27 = 0;
  local_19e8 = "0123456789abcdefghijklmnopqrstuvwxyz";
  uVar17 = 0;
LAB_0014286f:
  lVar15 = local_1028[uVar27 * 4 + 1];
  uVar18 = *(uint *)(&local_1030 + uVar27 * 4);
  if (lVar15 != 0) {
    lVar24 = local_1028[uVar27 * 4];
    lVar28 = 0;
    do {
      iVar3 = (int)lVar28;
      if (*(uchar *)(lVar24 + lVar28) == '\0') break;
      iVar3 = (*stream)(*(uchar *)(lVar24 + lVar28),userp);
      if (iVar3 != 0) {
        uVar17 = uVar17 + (int)lVar28;
        lVar15 = 1;
        bVar34 = false;
        local_19f0 = (byte *)(ulong)uVar17;
        goto LAB_001428f4;
      }
      lVar28 = lVar28 + 1;
      iVar3 = (int)lVar15;
    } while (lVar15 != lVar28);
    uVar17 = iVar3 + uVar17;
    bVar34 = (uVar18 & 0x100000) == 0;
    lVar15 = 0;
LAB_001428f4:
    if (bVar34) goto LAB_00142900;
    goto LAB_001432f8;
  }
LAB_00142900:
  uVar20 = local_1038[uVar27 * 8];
  uVar29 = (ulong)uVar20;
  if ((uVar18 >> 0xe & 1) != 0) {
    uVar20 = *(uint *)(local_1830 + (long)(int)uVar20 * 2);
    uVar29 = (ulong)uVar20;
    if ((int)uVar20 < 0) {
      uVar29 = (ulong)-uVar20;
      uVar18 = uVar18 & 0xfffffefb | 4;
    }
  }
  iVar3 = (int)uVar29;
  if ((uVar18 >> 0x10 & 1) == 0) {
    uVar20 = 0xffffffff;
    if ((short)uVar18 < 0) {
      uVar20 = local_1038[uVar27 * 8 + 1];
    }
  }
  else {
    uVar20 = *(uint *)(local_1830 + (long)(int)local_1038[uVar27 * 8 + 1] * 2);
    if ((int)uVar20 < 0) {
      uVar20 = 0xffffffff;
    }
  }
  uVar7 = (ulong)*(uint *)((long)local_1028 + uVar27 * 0x20 + -4);
  uVar9 = uVar17;
  if (9 < local_1838[uVar7 * 4]) goto LAB_001432f6;
  uVar26 = uVar18 & 8;
  switch(local_1838[uVar7 * 4]) {
  case 0:
    __s = (char *)local_1830[uVar7 * 2];
    if (__s == (char *)0x0) {
      if (uVar20 == 0xffffffff || 4 < (int)uVar20) {
        uVar18 = uVar18 & 0xfffffff7;
        sVar8 = 5;
        __s = "(nil)";
      }
      else {
        __s = "";
LAB_00142feb:
        sVar8 = 0;
      }
    }
    else if (uVar20 == 0xffffffff) {
      if (*__s == '\0') goto LAB_00142feb;
      sVar8 = strlen(__s);
    }
    else {
      sVar8 = (size_t)(int)uVar20;
    }
    uVar29 = 0x7fffffff;
    if (sVar8 < 0x7fffffff) {
      uVar29 = sVar8;
    }
    if ((uVar18 & 8) == 0) {
LAB_00143024:
      iVar14 = iVar3 - (int)uVar29;
      if ((uVar18 & 4) == 0) {
        if (iVar14 < 1) {
          iVar14 = iVar14 + -1;
        }
        else {
          iVar3 = iVar3 + uVar17;
          do {
            iVar4 = (*stream)(' ',userp);
            if (iVar4 != 0) goto LAB_00143182;
            uVar17 = uVar17 + 1;
            iVar4 = iVar14 + -1;
            bVar34 = 0 < iVar14;
            iVar14 = iVar4;
          } while (iVar4 != 0 && bVar34);
          iVar14 = -1;
          uVar17 = iVar3 - (int)uVar29;
        }
      }
      uVar20 = uVar17;
      if (sVar8 != 0) {
        uVar20 = uVar17 + (int)sVar8;
        uVar29 = 0;
        do {
          if (__s[uVar29] == '\0') {
            uVar20 = uVar17 + (int)uVar29;
            break;
          }
          iVar3 = (*stream)(__s[uVar29],userp);
          if (iVar3 != 0) {
            uVar17 = uVar17 + (int)uVar29;
            goto LAB_00143182;
          }
          uVar29 = uVar29 + 1;
        } while (sVar8 != uVar29);
      }
      uVar17 = uVar20;
      if (((uVar18 & 4) != 0) && (0 < iVar14)) {
        iVar3 = iVar14 + 1;
        uVar9 = uVar20;
        do {
          uVar17 = uVar9;
          iVar4 = (*stream)(' ',userp);
          if (iVar4 != 0) goto LAB_00143182;
          uVar9 = uVar17 + 1;
          iVar3 = iVar3 + -1;
          uVar17 = iVar14 + uVar20;
        } while (1 < iVar3);
      }
      lVar15 = 10;
      bVar34 = true;
      if ((uVar18 & 8) != 0) {
        iVar3 = (*stream)('\"',userp);
        if (iVar3 != 0) goto LAB_00143182;
        uVar17 = uVar17 + 1;
      }
    }
    else {
      iVar14 = (*stream)('\"',userp);
      if (iVar14 == 0) {
        uVar17 = uVar17 + 1;
        goto LAB_00143024;
      }
LAB_00143182:
      lVar15 = 1;
      bVar34 = false;
      local_19f0 = (byte *)(ulong)uVar17;
    }
    break;
  case 1:
    dVar11 = local_1830[uVar7 * 2];
    if (dVar11 == 0.0) {
      if ((uVar18 & 4) == 0) {
        iVar3 = iVar3 + -5;
      }
      else if (iVar3 < 6) {
        iVar3 = iVar3 + -6;
      }
      else {
        iVar4 = iVar3 + -5;
        iVar14 = iVar3 + uVar17;
        do {
          iVar3 = (*stream)(' ',userp);
          if (iVar3 != 0) goto LAB_001432d8;
          uVar17 = uVar17 + 1;
          iVar4 = iVar4 + -1;
        } while (0 < iVar4);
        iVar3 = -1;
        uVar17 = iVar14 - 5;
      }
      uVar20 = uVar17 + 5;
      uVar2 = '(';
      lVar15 = 0;
LAB_0014327d:
      iVar14 = (*stream)(uVar2,userp);
      if (iVar14 == 0) goto code_r0x0014328d;
      uVar17 = uVar17 + (int)lVar15;
LAB_001432d8:
      bVar34 = false;
      local_19f0 = (byte *)(ulong)uVar17;
      uVar9 = uVar17;
      goto LAB_001432ed;
    }
    local_19e8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    if ((uVar18 >> 0xc & 1) == 0) {
      local_19e8 = "0123456789abcdefghijklmnopqrstuvwxyz";
    }
    dVar21 = 7.90505033345994e-323;
    bVar1 = 1;
    bVar19 = 0;
    bVar34 = false;
    bVar22 = 0;
    local_19fc = 1;
    goto LAB_00142c3a;
  case 2:
    if (((uVar18 & 0x40) == 0) && ((uVar18 & 0x20) == 0)) {
      if ((uVar18 & 0x10) == 0) {
        *(uint *)local_1830[uVar7 * 2] = uVar17;
      }
      else {
        *(short *)local_1830[uVar7 * 2] = (short)uVar17;
      }
    }
    else {
      *(long *)local_1830[uVar7 * 2] = (long)(int)uVar17;
    }
    goto LAB_001432f6;
  default:
    goto switchD_0014299e_caseD_3;
  case 6:
  case 7:
  case 8:
    uVar18 = uVar18 | 0x200;
switchD_0014299e_caseD_3:
    dVar11 = local_1830[uVar7 * 2];
    if ((uVar18 >> 0x11 & 1) == 0) {
      bVar1 = (byte)(uVar26 >> 3);
      if ((uVar18 >> 10 & 1) == 0) {
        if ((uVar18 >> 0xb & 1) == 0) {
          dVar21 = 4.94065645841247e-323;
          bVar34 = true;
          if ((uVar18 >> 9 & 1) != 0) {
            bVar22 = 0;
            bVar34 = true;
            goto LAB_00142a58;
          }
          dVar16 = (double)-(long)dVar11;
          if (0 < (long)dVar11) {
            dVar16 = dVar11;
          }
          bVar19 = (byte)((ulong)dVar11 >> 0x3f);
          bVar22 = 0;
          local_19fc = 0;
          dVar11 = dVar16;
        }
        else {
          local_19e8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
          if ((uVar18 >> 0xc & 1) == 0) {
            local_19e8 = "0123456789abcdefghijklmnopqrstuvwxyz";
          }
          dVar21 = 7.90505033345994e-323;
          local_19fc = 1;
          bVar19 = 0;
          bVar34 = false;
          bVar22 = 0;
        }
      }
      else {
        dVar21 = 3.95252516672997e-323;
        bVar22 = 1;
        bVar34 = false;
LAB_00142a58:
        bVar19 = 0;
        local_19fc = 0;
      }
LAB_00142c3a:
      if (uVar20 == 0xffffffff) {
        uVar20 = 1;
      }
      if (bVar34) {
        if (dVar11 == 0.0) {
LAB_00142cbc:
          uVar29 = 0x144;
        }
        else {
          uVar29 = 0x144;
          do {
            *(byte *)((long)&local_1988 + uVar29) =
                 SUB81(dVar11,0) + (char)((ulong)dVar11 / 10) * -10 | 0x30;
            uVar29 = uVar29 - 1;
            bVar34 = 9 < (ulong)dVar11;
            dVar11 = (double)((ulong)dVar11 / 10);
          } while (bVar34);
        }
      }
      else {
        if (dVar11 == 0.0) goto LAB_00142cbc;
        uVar29 = 0x144;
        do {
          *(char *)((long)&local_1988 + uVar29) = local_19e8[(ulong)dVar11 % (ulong)dVar21];
          uVar29 = uVar29 - 1;
          bVar34 = (ulong)dVar21 <= (ulong)dVar11;
          dVar11 = (double)((ulong)dVar11 / (ulong)dVar21);
        } while (bVar34);
      }
      iVar4 = (int)uVar29;
      iVar14 = 0x144 - iVar4;
      iVar3 = iVar3 - iVar14;
      iVar14 = uVar20 - iVar14;
      if (((bVar22 & bVar1) == 1) && (iVar14 < 1)) {
        *(undefined1 *)((long)&local_1988 + uVar29) = 0x30;
        uVar29 = uVar29 - 1;
        iVar3 = iVar3 + -1;
      }
      if ((0 < iVar14) && (iVar3 = iVar3 - iVar14, -1 < (long)uVar29)) {
        uVar7 = (ulong)((uVar20 + iVar4) - 0x145);
        if (uVar29 < uVar7) {
          uVar7 = uVar29;
        }
        memset((void *)((long)&local_1988 + (uVar29 - uVar7)),0x30,uVar7 + 1);
        uVar29 = uVar29 + ~uVar7;
      }
      iVar14 = iVar3 + -2;
      if ((local_19fc & bVar1) == 0) {
        iVar14 = iVar3;
      }
      uVar20 = (uint)((uVar18 & 3) != 0 | bVar19);
      iVar3 = iVar14 - uVar20;
      if ((uVar18 & 0x104) == 0) {
        if (iVar3 < 1) {
          iVar3 = iVar3 + -1;
        }
        else {
          iVar14 = iVar14 + uVar17;
          do {
            iVar4 = (*stream)(' ',userp);
            if (iVar4 != 0) goto LAB_0014325f;
            uVar17 = uVar17 + 1;
            iVar4 = iVar3 + -1;
            bVar34 = 0 < iVar3;
            iVar3 = iVar4;
          } while (iVar4 != 0 && bVar34);
          iVar3 = -1;
          uVar17 = iVar14 - uVar20;
        }
      }
      if (bVar19 == 0) {
        if ((uVar18 & 2) != 0) {
          uVar2 = '+';
          goto LAB_00142dd0;
        }
        if ((uVar18 & 1) != 0) {
          uVar2 = ' ';
          goto LAB_00142dd0;
        }
      }
      else {
        uVar2 = '-';
LAB_00142dd0:
        iVar14 = (*stream)(uVar2,userp);
        if (iVar14 != 0) goto LAB_0014325f;
        uVar17 = uVar17 + 1;
      }
      if ((local_19fc & bVar1) != 0) {
        iVar14 = (*stream)('0',userp);
        lVar15 = 1;
        if (iVar14 != 0) goto LAB_0014325f;
        if ((uVar18 >> 0xc & 1) == 0) {
          uVar2 = 'x';
        }
        else {
          uVar2 = 'X';
        }
        iVar14 = (*stream)(uVar2,userp);
        if (iVar14 != 0) {
          local_19f0 = (byte *)(ulong)(uVar17 + 1);
          uVar17 = uVar17 + 1;
          goto LAB_001432f8;
        }
        uVar17 = uVar17 + 2;
      }
      if ((uVar18 & 0x104) == 0x100) {
        if (iVar3 < 1) {
          iVar3 = iVar3 + -1;
        }
        else {
          uVar20 = iVar3 + uVar17;
          do {
            iVar14 = (*stream)('0',userp);
            if (iVar14 != 0) goto LAB_0014325f;
            uVar17 = uVar17 + 1;
            iVar14 = iVar3 + -1;
            bVar34 = 0 < iVar3;
            iVar3 = iVar14;
          } while (iVar14 != 0 && bVar34);
          iVar3 = -1;
          uVar17 = uVar20;
        }
      }
      uVar20 = uVar17;
      if ((long)uVar29 < 0x144) {
        uVar20 = (uVar17 - (int)uVar29) + 0x144;
        do {
          iVar14 = (*stream)(*(uchar *)((long)&local_1988 + uVar29 + 1),userp);
          if (iVar14 != 0) goto LAB_0014325f;
          uVar29 = uVar29 + 1;
          uVar17 = uVar17 + 1;
        } while (uVar29 != 0x144);
      }
      uVar9 = uVar20;
      if (((uVar18 & 4) != 0) && (0 < iVar3)) {
        uVar9 = iVar3 + uVar20;
        iVar3 = iVar3 + 1;
        uVar17 = uVar20;
        do {
          iVar14 = (*stream)(' ',userp);
          if (iVar14 != 0) goto LAB_0014325f;
          uVar17 = uVar17 + 1;
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
      }
      goto LAB_001432f6;
    }
    if ((uVar18 & 4) == 0) {
      if (iVar3 < 2) {
        iVar3 = iVar3 + -1;
      }
      else {
        iVar14 = iVar3 + uVar17;
        do {
          iVar3 = (*stream)(' ',userp);
          if (iVar3 != 0) goto LAB_0014325f;
          uVar17 = uVar17 + 1;
          uVar20 = (int)uVar29 - 1;
          uVar29 = (ulong)uVar20;
        } while (1 < (int)uVar20);
        iVar3 = 0;
        uVar17 = iVar14 - 1;
      }
    }
    iVar14 = (*stream)(SUB81(dVar11,0),userp);
    lVar15 = 1;
    if (iVar14 == 0) {
      uVar20 = uVar17 + 1;
      uVar9 = uVar20;
      if (((uVar18 & 4) != 0) && (1 < iVar3)) {
        uVar9 = uVar17 + iVar3;
        iVar3 = iVar3 + 1;
        do {
          iVar14 = (*stream)(' ',userp);
          if (iVar14 != 0) {
            local_19f0 = (byte *)(ulong)uVar20;
            uVar17 = uVar20;
            goto LAB_001432f8;
          }
          uVar20 = uVar20 + 1;
          iVar3 = iVar3 + -1;
        } while (2 < iVar3);
      }
      goto LAB_001432f6;
    }
LAB_0014325f:
    lVar15 = 1;
    local_19f0 = (byte *)(ulong)uVar17;
    goto LAB_001432f8;
  case 9:
    local_19a8 = 0;
    uStack_19a0 = 0;
    local_19b8 = (byte *)0x25;
    uStack_19b0 = 0;
    sVar8 = strlen((char *)&local_19b8);
    if ((uVar18 >> 0xd & 1) != 0) {
      uVar29 = (ulong)local_1038[uVar27 * 8];
    }
    if ((short)uVar18 < 0) {
      uVar20 = local_1038[uVar27 * 8 + 1];
    }
    pbVar5 = (byte *)((long)&local_19b8 + 1);
    if ((uVar18 & 4) != 0) {
      local_19b8._0_2_ = CONCAT11(0x2d,(char)local_19b8);
      pbVar5 = (byte *)((long)&local_19b8 + 2);
    }
    if ((uVar18 & 2) != 0) {
      *pbVar5 = 0x2b;
      pbVar5 = pbVar5 + 1;
    }
    if ((uVar18 & 1) != 0) {
      *pbVar5 = 0x20;
      pbVar5 = pbVar5 + 1;
    }
    if ((uVar18 & 8) != 0) {
      *pbVar5 = 0x23;
      pbVar5 = pbVar5 + 1;
    }
    maxlength = 0x20 - sVar8;
    *pbVar5 = 0;
    if (-1 < (int)uVar29) {
      if (0x144 < (int)uVar29) {
        uVar29 = 0x145;
      }
      iVar3 = curl_msnprintf((char *)pbVar5,maxlength,"%d",uVar29);
      pbVar5 = pbVar5 + iVar3;
      maxlength = maxlength - (long)iVar3;
    }
    if (-1 < (int)uVar20) {
      dVar11 = local_1830[uVar7 * 2];
      lVar15 = 0x144 - uVar29;
      if ((int)uVar29 < (int)uVar20) {
        lVar15 = 0x144;
      }
      if ((int)uVar29 < 1) {
        lVar15 = 0x144;
      }
      for (; 10.0 <= dVar11; dVar11 = dVar11 / 10.0) {
        lVar15 = lVar15 + -1;
      }
      uVar9 = (int)lVar15 - 1;
      if ((int)uVar20 <= (int)lVar15) {
        uVar9 = uVar20;
      }
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      iVar3 = curl_msnprintf((char *)pbVar5,maxlength,".%d",(ulong)uVar9);
      pbVar5 = pbVar5 + iVar3;
    }
    if ((uVar18 & 0x20) != 0) {
      *pbVar5 = 0x6c;
      pbVar5 = pbVar5 + 1;
    }
    if ((uVar18 >> 0x12 & 1) == 0) {
      bVar1 = 0x66;
      if ((uVar18 >> 0x13 & 1) != 0) {
        bVar1 = ((uVar18 >> 0xc & 1) == 0) << 5 | 0x47;
      }
    }
    else {
      bVar1 = ((uVar18 >> 0xc & 1) == 0) << 5 | 0x45;
    }
    *pbVar5 = bVar1;
    pbVar5[1] = 0;
    snprintf((char *)&local_1988,0x146,(char *)&local_19b8,SUB84(local_1830[uVar7 * 2],0));
    lVar15 = 10;
    bVar34 = (uchar)local_1988 == '\0';
    if (!bVar34) {
      iVar3 = (*stream)((uchar)local_1988,userp);
      puVar32 = (uchar *)((long)&local_1988 + 1);
      while (iVar3 == 0) {
        uVar17 = uVar17 + 1;
        bVar34 = *puVar32 == '\0';
        if (bVar34) goto joined_r0x00142f68;
        iVar3 = (*stream)(*puVar32,userp);
        puVar32 = puVar32 + 1;
      }
      lVar15 = 1;
      local_19f0 = (byte *)(ulong)uVar17;
    }
  }
joined_r0x00142f68:
  uVar9 = uVar17;
  if (bVar34) goto LAB_001432f6;
  goto LAB_001432f8;
switchD_001422df_caseD_68:
LAB_00141f73:
  bVar34 = false;
  uVar31 = uVar17;
  iVar3 = iVar14;
  goto LAB_00142326;
code_r0x0014328d:
  uVar2 = "(nil)"[lVar15 + 1];
  lVar15 = lVar15 + 1;
  if (lVar15 == 5) goto code_r0x0014329b;
  goto LAB_0014327d;
code_r0x0014329b:
  bVar34 = true;
  uVar9 = uVar20;
  if (((uVar18 & 4) == 0) && (0 < iVar3)) {
    uVar9 = uVar17 + iVar3 + 5;
    iVar3 = iVar3 + 1;
    do {
      iVar14 = (*stream)(' ',userp);
      bVar34 = iVar14 == 0;
      if (!bVar34) {
        local_19f0 = (byte *)(ulong)uVar20;
        uVar9 = uVar20;
        break;
      }
      uVar20 = uVar20 + 1;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
LAB_001432ed:
  lVar15 = 1;
  uVar17 = uVar9;
  if (bVar34) {
LAB_001432f6:
    lVar15 = 0;
    uVar17 = uVar9;
  }
LAB_001432f8:
  if (lVar15 != 0) {
    return (int)local_19f0;
  }
  uVar27 = uVar27 + 1;
  if (uVar27 == uVar31) {
    return uVar17;
  }
  goto LAB_0014286f;
}

Assistant:

static int formatf(
  void *userp, /* untouched by format(), just sent to the stream() function in
                  the second argument */
  /* function pointer called for each output character */
  int (*stream)(unsigned char, void *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  static const char nilstr[] = "(nil)";
  const char *digits = lower_digits;   /* Base-36 digits for numbers.  */
  int done = 0;   /* number of characters written  */
  int i;
  int ocount = 0; /* number of output segments */
  int icount = 0; /* number of input arguments */

  struct outsegment output[MAX_SEGMENTS];
  struct va_input input[MAX_PARAMETERS];
  char work[BUFFSIZE];

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (FALSE?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Parse the format string */
  if(parsefmt(format, output, input, &ocount, &icount, ap_save))
    return 0;

  for(i = 0; i < ocount; i++) {
    struct outsegment *optr = &output[i];
    struct va_input *iptr;
    bool is_alt;            /* Format spec modifiers.  */
    int width;              /* Width of a field.  */
    int prec;               /* Precision of a field.  */
    bool is_neg;            /* Decimal integer is negative.  */
    unsigned long base;     /* Base of a number to be written.  */
    mp_uintmax_t num;       /* Integral values to be written.  */
    mp_intmax_t signed_num; /* Used to convert negative in positive.  */
    char *w;
    size_t outlen = optr->outlen;
    unsigned int flags = optr->flags;

    if(outlen) {
      char *str = optr->start;
      for(; outlen && *str; outlen--)
        OUTCHAR(*str++);
      if(optr->flags & FLAGS_SUBSTR)
        /* this is just a substring */
        continue;
    }

    /* pick up the specified width */
    if(flags & FLAGS_WIDTHPARAM) {
      width = (int)input[optr->width].val.nums;
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        if(width == INT_MIN)
          width = INT_MAX;
        else
          width = -width;
        flags |= FLAGS_LEFT;
        flags &= ~(unsigned int)FLAGS_PAD_NIL;
      }
    }
    else
      width = optr->width;

    /* pick up the specified precision */
    if(flags & FLAGS_PRECPARAM) {
      prec = (int)input[optr->precision].val.nums;
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(flags & FLAGS_PREC)
      prec = optr->precision;
    else
      prec = -1;

    is_alt = (flags & FLAGS_ALT) ? 1 : 0;
    iptr = &input[optr->input];

    switch(iptr->type) {
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      flags |= FLAGS_UNSIGNED;
      FALLTHROUGH();
    case FORMAT_INT:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
      num = iptr->val.numu;
      if(flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(flags & FLAGS_OCTAL) {
        /* Octal unsigned integer */
        base = 8;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer */
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        base = 16;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer */
        base = 10;
        is_neg = FALSE;
      }
      else {
        /* Decimal integer.  */
        base = 10;

        is_neg = (iptr->val.nums < (mp_intmax_t)0);
        if(is_neg) {
          /* signed_num might fail to hold absolute negative minimum by 1 */
          signed_num = iptr->val.nums + (mp_intmax_t)1;
          signed_num = -signed_num;
          num = (mp_uintmax_t)signed_num;
          num += (mp_uintmax_t)1;
        }
      }
number:
      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      switch(base) {
      case 10:
        while(num > 0) {
          *w-- = (char)('0' + (num % 10));
          num /= 10;
        }
        break;
      default:
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        break;
      }
      width -= (int)(workend - w);
      prec -= (int)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (flags & FLAGS_SHOWSIGN) || (flags & FLAGS_SPACE))
        --width;

      if(!(flags & FLAGS_LEFT) && !(flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(flags & FLAGS_LEFT) && (flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING: {
      const char *str;
      size_t len;

      str = (char *)iptr->val.str;
      if(!str) {
        /* Write null string if there is space.  */
        if(prec == -1 || prec >= (int) sizeof(nilstr) - 1) {
          str = nilstr;
          len = sizeof(nilstr) - 1;
          /* Disable quotes around (nil) */
          flags &= ~(unsigned int)FLAGS_ALT;
        }
        else {
          str = "";
          len = 0;
        }
      }
      else if(prec != -1)
        len = (size_t)prec;
      else if(*str == '\0')
        len = 0;
      else
        len = strlen(str);

      width -= (len > INT_MAX) ? INT_MAX : (int)len;

      if(flags & FLAGS_ALT)
        OUTCHAR('"');

      if(!(flags & FLAGS_LEFT))
        while(width-- > 0)
          OUTCHAR(' ');

      for(; len && *str; len--)
        OUTCHAR(*str++);
      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');

      if(flags & FLAGS_ALT)
        OUTCHAR('"');
      break;
    }

    case FORMAT_PTR:
      /* Generic pointer.  */
      if(iptr->val.ptr) {
        /* If the pointer is not NULL, write it as a %#x spec.  */
        base = 16;
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        is_alt = TRUE;
        num = (size_t) iptr->val.ptr;
        is_neg = FALSE;
        goto number;
      }
      else {
        /* Write "(nil)" for a nil pointer.  */
        const char *point;

        width -= (int)(sizeof(nilstr) - 1);
        if(flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
        for(point = nilstr; *point != '\0'; ++point)
          OUTCHAR(*point);
        if(!(flags & FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_DOUBLE: {
      char formatbuf[32]="%";
      char *fptr = &formatbuf[1];
      size_t left = sizeof(formatbuf)-strlen(formatbuf);
      int len;

      if(flags & FLAGS_WIDTH)
        width = optr->width;

      if(flags & FLAGS_PREC)
        prec = optr->precision;

      if(flags & FLAGS_LEFT)
        *fptr++ = '-';
      if(flags & FLAGS_SHOWSIGN)
        *fptr++ = '+';
      if(flags & FLAGS_SPACE)
        *fptr++ = ' ';
      if(flags & FLAGS_ALT)
        *fptr++ = '#';

      *fptr = 0;

      if(width >= 0) {
        size_t dlen;
        if(width >= (int)sizeof(work))
          width = sizeof(work)-1;
        /* RECURSIVE USAGE */
        dlen = (size_t)curl_msnprintf(fptr, left, "%d", width);
        fptr += dlen;
        left -= dlen;
      }
      if(prec >= 0) {
        /* for each digit in the integer part, we can have one less
           precision */
        size_t maxprec = sizeof(work) - 2;
        double val = iptr->val.dnum;
        if(width > 0 && prec <= width)
          maxprec -= (size_t)width;
        while(val >= 10.0) {
          val /= 10;
          maxprec--;
        }

        if(prec > (int)maxprec)
          prec = (int)maxprec-1;
        if(prec < 0)
          prec = 0;
        /* RECURSIVE USAGE */
        len = curl_msnprintf(fptr, left, ".%d", prec);
        fptr += len;
      }
      if(flags & FLAGS_LONG)
        *fptr++ = 'l';

      if(flags & FLAGS_FLOATE)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'E' : 'e');
      else if(flags & FLAGS_FLOATG)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'G' : 'g');
      else
        *fptr++ = 'f';

      *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
      /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
         output characters */
#ifdef HAVE_SNPRINTF
      (snprintf)(work, sizeof(work), formatbuf, iptr->val.dnum);
#else
      (sprintf)(work, formatbuf, iptr->val.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
      DEBUGASSERT(strlen(work) <= sizeof(work));
      for(fptr = work; *fptr; fptr++)
        OUTCHAR(*fptr);
      break;
    }

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) iptr->val.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(flags & FLAGS_LONG)
          *(long *) iptr->val.ptr = (long)done;
      else if(!(flags & FLAGS_SHORT))
        *(int *) iptr->val.ptr = (int)done;
      else
        *(short *) iptr->val.ptr = (short)done;
      break;

    default:
      break;
    }
  }
  return done;
}